

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

int __thiscall
luna::Function::AddUpvalue(Function *this,String *name,bool parent_local,int register_index)

{
  size_type sVar1;
  int in_ECX;
  byte in_DL;
  String *in_RSI;
  vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_> *in_RDI;
  value_type *__x;
  UpvalueInfo local_28;
  undefined1 local_11;
  
  local_11 = in_DL & 1;
  __x = (value_type *)(in_RDI + 6);
  UpvalueInfo::UpvalueInfo(&local_28,in_RSI,(bool)local_11,in_ECX);
  std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::push_back
            (in_RDI,__x);
  sVar1 = std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::
          size(in_RDI + 6);
  return (int)sVar1 + -1;
}

Assistant:

int Function::AddUpvalue(String *name, bool parent_local, int register_index)
    {
        upvalues_.push_back(UpvalueInfo(name, parent_local, register_index));
        return upvalues_.size() - 1;
    }